

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantOuterTriangleSetTestInstance::
compare(InvariantOuterTriangleSetTestInstance *this,PerPrimitiveVec *primitivesA,
       PerPrimitiveVec *primitivesB,int outerEdgeNdx)

{
  long lVar1;
  float *pfVar2;
  undefined4 *puVar3;
  _Rb_tree_header *p_Var4;
  ostringstream *poVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  TessPrimitiveType TVar9;
  TestLog *pTVar10;
  pointer pPVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  _Link_type p_Var15;
  int i;
  undefined8 *puVar16;
  long lVar17;
  _Rb_tree_header *p_Var18;
  _Rb_tree_node_base *p_Var19;
  _Rb_tree_node_base *p_Var20;
  _Base_ptr p_Var21;
  long *plVar22;
  bool bVar23;
  long lVar24;
  long lVar25;
  _Link_type p_Var26;
  long *plVar27;
  ulong *puVar28;
  _Link_type p_Var29;
  Vector<tcu::Vector<float,_3>,_3> *b;
  Vector<tcu::Vector<float,_3>,_3> *b_00;
  ulong uVar30;
  uint uVar31;
  _Link_type __x;
  int iVar32;
  _Link_type p_Var33;
  ulong uVar34;
  undefined8 in_R10;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  Vec3 avg;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  ulong *local_308;
  ulong local_300;
  ulong local_2f8;
  long lStack_2f0;
  _Link_type local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8 [32];
  long *local_2b8;
  ulong local_2b0;
  long local_2a8;
  long lStack_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *local_280;
  undefined1 *local_278;
  ulong local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
  local_258;
  string local_240;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_220;
  TestLog *local_1f0;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_1e8;
  undefined1 local_1b8 [12];
  float afStack_1ac [5];
  uchar local_198 [4];
  undefined1 local_194 [84];
  ios_base local_140 [272];
  
  TVar9 = (this->super_InvarianceTestInstance).m_caseDef.primitiveType;
  local_2d8._16_8_ = primitivesA;
  local_2d8._24_8_ = primitivesB;
  if (TVar9 == TESSPRIMITIVETYPE_QUADS) {
    local_1f0 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->
                m_log;
    outerEdgeDescriptions(&local_258,TESSPRIMITIVETYPE_QUADS);
    tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
              (&local_240,
               local_258.
               super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
               ._M_impl.super__Vector_impl_data._M_start + outerEdgeNdx);
    puVar16 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,0xb1c755);
    __x = (_Link_type)local_2d8;
    local_2e8 = __x;
    p_Var26 = (_Link_type)(puVar16 + 2);
    if ((_Link_type)*puVar16 == p_Var26) {
      local_2d8._0_8_ = *(long *)&p_Var26->super__Rb_tree_node_base;
      local_2d8._8_8_ = (_Base_ptr)puVar16[3];
    }
    else {
      local_2e8 = (_Link_type)*puVar16;
      local_2d8._0_8_ = *(long *)&p_Var26->super__Rb_tree_node_base;
    }
    p_Var15 = local_2e8;
    local_2e0 = puVar16[1];
    *puVar16 = p_Var26;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    local_298 = (long)*(pointer *)(local_2d8._16_8_ + 8) - *(long *)local_2d8._16_8_;
    pPVar11 = *(pointer *)(local_2d8._24_8_ + 8);
    lVar1 = *(long *)local_2d8._24_8_;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e8._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e8._M_t._M_impl._0_1_ = 0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_220._M_t._M_impl.super__Rb_tree_header._M_header;
    local_220._M_t._M_impl._0_1_ = 0;
    local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_220._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar17 = (long)(outerEdgeNdx % 2);
    fVar40 = 0.0;
    if (1 < outerEdgeNdx) {
      fVar40 = 1.0;
    }
    uVar35 = CONCAT71((int7)((ulong)in_R10 >> 8),1);
    local_290 = CONCAT44(local_290._4_4_,fVar40);
    do {
      bVar37 = (char)uVar35 != '\0';
      uVar30 = (long)pPVar11 - lVar1;
      if (bVar37) {
        uVar30 = local_298;
      }
      local_280 = &local_220;
      if (bVar37) {
        local_280 = &local_1e8;
      }
      uVar31 = (uint)(uVar30 >> 6);
      if (0 < (int)uVar31) {
        uVar30 = 0;
        local_288 = CONCAT44(local_288._4_4_,(int)uVar35);
        do {
          p_Var21 = (_Base_ptr)local_2d8._24_8_;
          if ((uVar35 & 1) != 0) {
            p_Var21 = (_Base_ptr)local_2d8._16_8_;
          }
          lVar24 = *(long *)p_Var21;
          lVar25 = uVar30 * 0x40;
          uVar7 = *(undefined8 *)(lVar24 + 0x14 + lVar25);
          puVar3 = (undefined4 *)(lVar24 + 0x24 + lVar25);
          uVar8 = *(undefined8 *)(lVar24 + 0x30 + lVar25);
          local_1b8._4_4_ = (int)uVar7;
          local_1b8._0_4_ = *(undefined4 *)(lVar24 + 0x10 + lVar25);
          local_1b8._8_4_ = (int)((ulong)uVar7 >> 0x20);
          afStack_1ac[0] = *(float *)(lVar24 + 0x20 + lVar25);
          afStack_1ac[1] = (float)*puVar3;
          afStack_1ac[2] = (float)puVar3[1];
          afStack_1ac[3] = (float)(int)uVar8;
          afStack_1ac[4] = (float)(int)((ulong)uVar8 >> 0x20);
          local_198 = (uchar  [4])*(undefined4 *)(lVar24 + 0x38 + lVar25);
          bVar37 = true;
          p_Var26 = (_Link_type)local_1b8;
          p_Var29 = (_Link_type)0x0;
          do {
            __x = p_Var29;
            p_Var29 = (_Link_type)((long)&(__x->super__Rb_tree_node_base)._M_color + 1);
            p_Var33 = (_Link_type)0x0;
            if (__x != (_Link_type)0x2) {
              p_Var33 = p_Var29;
            }
            uVar34 = (ulong)((int)__x - 1);
            if (__x == (_Link_type)0x0) {
              uVar34 = 2;
            }
            puVar16 = (undefined8 *)(local_1b8 + (long)p_Var33 * 0xc);
            fVar6 = *(float *)((p_Var26->_M_storage)._M_storage + lVar17 * 4 + -0x20);
            if (fVar6 == fVar40) {
              fVar38 = *(float *)((long)puVar16 + lVar17 * 4);
              if ((fVar38 == fVar40) && (!NAN(fVar38) && !NAN(fVar40))) break;
            }
            if ((*(float *)(local_1b8 + uVar34 * 0xc + lVar17 * 4) == fVar40) &&
               (((!NAN(*(float *)(local_1b8 + uVar34 * 0xc + lVar17 * 4)) && !NAN(fVar40) &&
                 (fVar38 = (float)*(undefined8 *)&p_Var26->super__Rb_tree_node_base,
                 fVar39 = (float)((ulong)*(undefined8 *)&p_Var26->super__Rb_tree_node_base >> 0x20),
                 auVar13._4_4_ = -(uint)(fVar39 == 0.0), auVar13._0_4_ = -(uint)(fVar38 == 0.0),
                 auVar13._8_4_ = -(uint)(fVar38 == 1.0), auVar13._12_4_ = -(uint)(fVar39 == 1.0),
                 iVar32 = movmskps((int)(uVar34 * 3),auVar13), iVar32 == 0)) &&
                (fVar38 = (float)*puVar16, fVar39 = (float)((ulong)*puVar16 >> 0x20),
                auVar14._4_4_ = -(uint)(fVar39 == 0.0), auVar14._0_4_ = -(uint)(fVar38 == 0.0),
                auVar14._8_4_ = -(uint)(fVar38 == 1.0), auVar14._12_4_ = -(uint)(fVar39 == 1.0),
                iVar32 = movmskps(0,auVar14), iVar32 == 0)))) {
              pfVar2 = (float *)((long)puVar16 + lVar17 * 4);
              if ((fVar6 == *pfVar2) && (!NAN(fVar6) && !NAN(*pfVar2))) break;
            }
            bVar37 = __x < (_Link_type)0x2;
            p_Var26 = (_Link_type)((long)&(p_Var26->super__Rb_tree_node_base)._M_parent + 4);
          } while (p_Var29 != (_Link_type)0x3);
          if (bVar37) {
            std::
            __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>>
                      ((_Link_type)local_1b8,local_194);
            __x = (_Link_type)local_1b8;
            std::
            set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
            ::insert(local_280,(value_type *)local_1b8);
            uVar35 = local_288 & 0xffffffff;
            fVar40 = (float)local_290;
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != (uVar31 & 0x7fffffff));
      }
      pTVar10 = local_1f0;
      uVar30 = uVar35 & 1;
      uVar35 = 0;
    } while (uVar30 != 0);
    p_Var4 = &local_1e8._M_t._M_impl.super__Rb_tree_header;
    bVar37 = true;
    p_Var19 = local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var20 = local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
        &local_220._M_t._M_impl.super__Rb_tree_header &&
        (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var4)
    goto LAB_0077756e;
    do {
      p_Var18 = &local_220._M_t._M_impl.super__Rb_tree_header;
      bVar36 = (_Rb_tree_header *)p_Var20 == p_Var18;
      bVar37 = (_Rb_tree_header *)p_Var19 == p_Var4;
      if ((bVar37) || ((_Rb_tree_header *)p_Var20 == p_Var18)) {
LAB_00777078:
        poVar5 = (ostringstream *)(local_1b8 + 8);
        local_1b8._0_8_ = pTVar10;
        std::__cxx11::ostringstream::ostringstream(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,
                   "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                   ,0x5a);
        if (p_Var15 == (_Link_type)0x0) {
          local_308 = &local_2f8;
          local_300 = 0;
          local_2f8 = local_2f8 & 0xffffffffffffff00;
        }
        else {
          local_278 = &local_268;
          local_270 = 0;
          local_268 = 0;
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
          local_2b8 = &local_2a8;
          plVar22 = puVar16 + 2;
          if ((long *)*puVar16 == plVar22) {
            local_2a8 = *plVar22;
            lStack_2a0 = puVar16[3];
          }
          else {
            local_2a8 = *plVar22;
            local_2b8 = (long *)*puVar16;
          }
          local_2b0 = puVar16[1];
          *puVar16 = plVar22;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_2b8);
          local_308 = &local_2f8;
          puVar28 = (ulong *)(plVar22 + 2);
          if ((ulong *)*plVar22 == puVar28) {
            local_2f8 = *puVar28;
            lStack_2f0 = plVar22[3];
          }
          else {
            local_2f8 = *puVar28;
            local_308 = (ulong *)*plVar22;
          }
          local_300 = plVar22[1];
          *plVar22 = (long)puVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_308,local_300);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_308 != &local_2f8) {
          operator_delete(local_308,local_2f8 + 1);
        }
        if (p_Var15 != (_Link_type)0x0) {
          if (local_2b8 != &local_2a8) {
            operator_delete(local_2b8,local_2a8 + 1);
          }
          if (local_278 != &local_268) {
            operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
          }
        }
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_140);
        if ((bVar37) ||
           ((!bVar36 &&
            (bVar37 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                      ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                    *)(p_Var19 + 1),
                                   (Vector<tcu::Vector<float,_3>,_3> *)(p_Var20 + 1),b_00), !bVar37)
            ))) {
          poVar5 = (ostringstream *)(local_1b8 + 8);
          local_1b8._0_8_ = pTVar10;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,"Note: e.g. triangle ",0x14);
          tcu::operator<<((ostream *)poVar5,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var20 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5," exists for second case but not for first",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          poVar5 = (ostringstream *)(local_1b8 + 8);
          local_1b8._0_8_ = pTVar10;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,"Note: e.g. triangle ",0x14);
          tcu::operator<<((ostream *)poVar5,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var19 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5," exists for first case but not for second",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        goto LAB_00777559;
      }
      __x = (_Link_type)(p_Var20 + 1);
      bVar37 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                         ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var19 + 1),
                          (Vector<tcu::Vector<float,_3>,_3> *)__x);
      if (!bVar37) {
        bVar37 = false;
        bVar36 = false;
        goto LAB_00777078;
      }
      p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
      p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
    } while (((_Rb_tree_header *)p_Var19 != p_Var4) ||
            ((_Rb_tree_header *)p_Var20 != &local_220._M_t._M_impl.super__Rb_tree_header));
  }
  else {
    if (TVar9 != TESSPRIMITIVETYPE_TRIANGLES) {
      return true;
    }
    pTVar10 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    outerEdgeDescriptions(&local_258,TESSPRIMITIVETYPE_TRIANGLES);
    uVar35 = (ulong)outerEdgeNdx;
    tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
              (&local_240,
               local_258.
               super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar35);
    puVar16 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,0xb1c755);
    __x = (_Link_type)local_2d8;
    local_2e8 = __x;
    p_Var26 = (_Link_type)(puVar16 + 2);
    if ((_Link_type)*puVar16 == p_Var26) {
      local_2d8._0_8_ = *(long *)&p_Var26->super__Rb_tree_node_base;
      local_2d8._8_8_ = (_Base_ptr)puVar16[3];
    }
    else {
      local_2e8 = (_Link_type)*puVar16;
      local_2d8._0_8_ = *(long *)&p_Var26->super__Rb_tree_node_base;
    }
    p_Var15 = local_2e8;
    local_2e0 = puVar16[1];
    *puVar16 = p_Var26;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    local_290 = (long)*(pointer *)(local_2d8._16_8_ + 8) - *(long *)local_2d8._16_8_;
    local_298 = (long)*(pointer *)(local_2d8._24_8_ + 8) - *(long *)local_2d8._24_8_;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e8._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e8._M_t._M_impl._0_1_ = 0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_220._M_t._M_impl.super__Rb_tree_header._M_header;
    local_220._M_t._M_impl._0_1_ = 0;
    local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_220._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar1 = uVar35 * 4;
    local_288 = uVar35;
    bVar37 = true;
    do {
      bVar36 = bVar37;
      uVar30 = local_298;
      if (bVar36) {
        uVar30 = local_290;
      }
      local_280 = &local_220;
      if (bVar36) {
        local_280 = &local_1e8;
      }
      uVar31 = (uint)(uVar30 >> 6);
      if (0 < (int)uVar31) {
        uVar30 = 0;
        do {
          p_Var21 = (_Base_ptr)local_2d8._24_8_;
          if (bVar36) {
            p_Var21 = (_Base_ptr)local_2d8._16_8_;
          }
          lVar17 = *(long *)p_Var21;
          lVar24 = uVar30 * 0x40;
          uVar7 = *(undefined8 *)(lVar17 + 0x14 + lVar24);
          puVar3 = (undefined4 *)(lVar17 + 0x24 + lVar24);
          uVar8 = *(undefined8 *)(lVar17 + 0x30 + lVar24);
          local_1b8._4_4_ = (int)uVar7;
          local_1b8._0_4_ = *(undefined4 *)(lVar17 + 0x10 + lVar24);
          local_1b8._8_4_ = (int)((ulong)uVar7 >> 0x20);
          afStack_1ac[0] = *(float *)(lVar17 + 0x20 + lVar24);
          afStack_1ac[1] = (float)*puVar3;
          afStack_1ac[2] = (float)puVar3[1];
          afStack_1ac[3] = (float)(int)uVar8;
          afStack_1ac[4] = (float)(int)((ulong)uVar8 >> 0x20);
          local_198 = (uchar  [4])*(undefined4 *)(lVar17 + 0x38 + lVar24);
          lVar17 = 0;
          bVar37 = false;
          do {
            bVar23 = bVar37;
            bVar12 = *(float *)(local_1b8 + lVar17 + lVar1) == 0.0;
            __x = (_Link_type)CONCAT71((int7)((ulong)__x >> 8),bVar12);
            lVar17 = lVar17 + 0xc;
            bVar37 = (bool)(bVar23 | bVar12);
          } while (lVar17 != 0x24);
          if (bVar23 || bVar12) {
            local_270 = local_270 & 0xffffffff00000000;
            local_278 = (undefined1 *)0x0;
            lVar17 = 0;
            do {
              *(float *)((long)&local_278 + lVar17 * 4) =
                   *(float *)(local_1b8 + lVar17 * 4) + afStack_1ac[lVar17];
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            local_2b0 = local_2b0 & 0xffffffff00000000;
            local_2b8 = (long *)0x0;
            lVar17 = 0;
            do {
              *(float *)((long)&local_2b8 + lVar17 * 4) =
                   *(float *)((long)&local_278 + lVar17 * 4) + afStack_1ac[lVar17 + 3];
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            local_300 = local_300 & 0xffffffff00000000;
            local_308 = (ulong *)0x0;
            lVar17 = 0;
            do {
              *(float *)((long)&local_308 + lVar17 * 4) =
                   *(float *)((long)&local_2b8 + lVar17 * 4) / 3.0;
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            fVar40 = *(float *)((long)&local_308 + uVar35 * 4);
            if ((fVar40 < *(float *)((long)&local_308 +
                                    (long)(((outerEdgeNdx + 1) / 3) * -3 + outerEdgeNdx + 1) * 4))
               && (fVar40 < *(float *)((long)&local_308 +
                                      (long)(((outerEdgeNdx + 2) / 3) * -3 + outerEdgeNdx + 2) * 4))
               ) {
              std::
              __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>>
                        (local_1b8,local_194);
              __x = (_Link_type)local_1b8;
              std::
              set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              ::insert(local_280,(value_type *)__x);
              uVar35 = local_288;
            }
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != (uVar31 & 0x7fffffff));
      }
      bVar37 = false;
    } while (bVar36);
    p_Var4 = &local_1e8._M_t._M_impl.super__Rb_tree_header;
    bVar37 = true;
    p_Var19 = local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var20 = local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
        &local_220._M_t._M_impl.super__Rb_tree_header &&
        (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var4)
    goto LAB_0077756e;
    do {
      p_Var18 = &local_220._M_t._M_impl.super__Rb_tree_header;
      bVar36 = (_Rb_tree_header *)p_Var20 == p_Var18;
      bVar37 = (_Rb_tree_header *)p_Var19 == p_Var4;
      if ((bVar37) || ((_Rb_tree_header *)p_Var20 == p_Var18)) {
LAB_00776fe4:
        poVar5 = (ostringstream *)(local_1b8 + 8);
        local_1b8._0_8_ = pTVar10;
        std::__cxx11::ostringstream::ostringstream(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,
                   "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                   ,0x5a);
        if (p_Var15 == (_Link_type)0x0) {
          local_308 = &local_2f8;
          local_300 = 0;
          local_2f8 = local_2f8 & 0xffffffffffffff00;
        }
        else {
          local_278 = &local_268;
          local_270 = 0;
          local_268 = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_278);
          local_2b8 = &local_2a8;
          plVar27 = plVar22 + 2;
          if ((long *)*plVar22 == plVar27) {
            local_2a8 = *plVar27;
            lStack_2a0 = plVar22[3];
          }
          else {
            local_2a8 = *plVar27;
            local_2b8 = (long *)*plVar22;
          }
          local_2b0 = plVar22[1];
          *plVar22 = (long)plVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_2b8);
          local_308 = &local_2f8;
          puVar28 = (ulong *)(plVar22 + 2);
          if ((ulong *)*plVar22 == puVar28) {
            local_2f8 = *puVar28;
            lStack_2f0 = plVar22[3];
          }
          else {
            local_2f8 = *puVar28;
            local_308 = (ulong *)*plVar22;
          }
          local_300 = plVar22[1];
          *plVar22 = (long)puVar28;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_308,local_300);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_308 != &local_2f8) {
          operator_delete(local_308,local_2f8 + 1);
        }
        if (p_Var15 != (_Link_type)0x0) {
          if (local_2b8 != &local_2a8) {
            operator_delete(local_2b8,local_2a8 + 1);
          }
          if (local_278 != &local_268) {
            operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
          }
        }
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_140);
        if ((bVar37) ||
           ((!bVar36 &&
            (bVar37 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                      ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                    *)(p_Var19 + 1),
                                   (Vector<tcu::Vector<float,_3>,_3> *)(p_Var20 + 1),b), !bVar37))))
        {
          poVar5 = (ostringstream *)(local_1b8 + 8);
          local_1b8._0_8_ = pTVar10;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,"Note: e.g. triangle ",0x14);
          tcu::operator<<((ostream *)poVar5,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var20 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5," exists for second case but not for first",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          poVar5 = (ostringstream *)(local_1b8 + 8);
          local_1b8._0_8_ = pTVar10;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,"Note: e.g. triangle ",0x14);
          tcu::operator<<((ostream *)poVar5,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var19 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5," exists for first case but not for second",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
LAB_00777559:
        __x = (_Link_type)&std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
        std::ios_base::~ios_base(local_140);
        bVar37 = false;
        goto LAB_0077756e;
      }
      __x = (_Link_type)(p_Var20 + 1);
      bVar37 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                         ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var19 + 1),
                          (Vector<tcu::Vector<float,_3>,_3> *)__x);
      if (!bVar37) {
        bVar37 = false;
        bVar36 = false;
        goto LAB_00776fe4;
      }
      p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
      p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
    } while (((_Rb_tree_header *)p_Var19 != p_Var4) ||
            ((_Rb_tree_header *)p_Var20 != &local_220._M_t._M_impl.super__Rb_tree_header));
  }
  bVar37 = true;
LAB_0077756e:
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_220._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  if (local_2e8 != (_Link_type)local_2d8) {
    operator_delete(local_2e8,local_2d8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if (local_258.
      super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar37;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int outerEdgeNdx) const
	{
		if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
		{
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(),
									   IsTriangleTriangleOnOuterEdge(outerEdgeNdx),
									   ("inner triangles, and outer triangles corresponding to other edge than edge "
										+ outerEdgeDescriptions(m_caseDef.primitiveType)[outerEdgeNdx].description()).c_str());
		}
		else if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
		{
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(),
									   IsQuadTriangleOnOuterEdge(outerEdgeNdx),
									   ("inner triangles, and outer triangles corresponding to other edge than edge "
										+ outerEdgeDescriptions(m_caseDef.primitiveType)[outerEdgeNdx].description()).c_str());
		}
		else
			DE_ASSERT(false);

		return true;
	}